

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
WriteFunc<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          e)

{
  BasicStringRef<char> value;
  Kind kind;
  char *in_RSI;
  BasicWriter<char> *in_RDI;
  size_t unaff_retaddr;
  Buffer<char> *s;
  char *in_stack_ffffffffffffffe0;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_ffffffffffffffe8;
  ExprBase e_00;
  
  s = in_RDI->buffer_;
  e_00.impl_ = (Impl *)in_RDI;
  kind = internal::ExprBase::kind((ExprBase *)0x19c8ba);
  mp::expr::str(kind);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI,(char *)s);
  value.size_ = unaff_retaddr;
  value.data_ = in_RSI;
  fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)e_00.impl_,value);
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            (in_stack_ffffffffffffffe8,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )e_00.impl_,in_stack_ffffffffffffffe0,(int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

void WriteFunc(Expr e) {
    writer_ << str(e.kind());
    WriteArgs(e);
  }